

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<_3bd87695_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::S...::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>>
::
emplace<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>
          (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::S___::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>>
           *this,pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
                 *key)

{
  EntryPointer psVar1;
  bool bVar2;
  EntryPointer current_entry;
  char distance_from_desired;
  EntryPointer psVar3;
  pair<_3bd87695_> pVar4;
  undefined1 auVar5 [16];
  size_t local_28;
  
  local_28 = 0;
  slang::detail::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&local_28,&key->first);
  current_entry =
       (EntryPointer)
       (*(long *)this +
       (((long)(key->first).
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
               super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
         (local_28 >> 2) + 0x9e3779b9 + local_28 * 0x40 ^ local_28) * -0x61c8864680b583eb >>
       ((byte)this[0x10] & 0x3f)) * 0x48);
  if (current_entry->distance_from_desired < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar3 = current_entry;
    do {
      bVar2 = std::
              __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_3UL>
              ::__eq(&key->first,&(psVar3->field_1).value.first);
      if (bVar2) {
        auVar5._0_8_ = psVar3;
        auVar5[8] = SUB81(0,0);
        auVar5._9_7_ = (int7)(0 >> 8);
        return (pair<_3bd87695_>)auVar5;
      }
      current_entry = psVar3 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar3 + 1;
      psVar3 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar4 = emplace_new_key<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>
                    (this,distance_from_desired,current_entry,key);
  return pVar4;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }